

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

char * __thiscall CaDiCaL::Parser::parse_string(Parser *this,char *str,char prev)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  Format *this_00;
  
  uVar4 = (uint)(byte)prev;
  while( true ) {
    if (*str == '\0') {
      return (char *)0x0;
    }
    uVar2 = parse_char(this);
    cVar1 = *str;
    if (uVar2 != (int)cVar1) break;
    str = str + 1;
    uVar4 = (int)cVar1;
  }
  Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
  this_00 = &this->internal->error_message;
  if (cVar1 == ' ') {
    pcVar3 = Format::append(this_00,"expected space after \'%c\'",(ulong)(uint)(int)(char)uVar4);
    return pcVar3;
  }
  pcVar3 = Format::append(this_00,"expected \'%c\' after \'%c\'",(ulong)(uint)(int)*str,
                          (ulong)(uint)(int)(char)uVar4);
  return pcVar3;
}

Assistant:

inline const char *Parser::parse_string (const char *str, char prev) {
  for (const char *p = str; *p; p++)
    if (parse_char () == *p)
      prev = *p;
    else if (*p == ' ')
      PER ("expected space after '%c'", prev);
    else
      PER ("expected '%c' after '%c'", *p, prev);
  return 0;
}